

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O0

BinaryOperatorTypes *
soul::TypeRules::getTypesForLogicalOp(BinaryOperatorTypes *__return_storage_ptr__,Type *a,Type *b)

{
  bool bVar1;
  ArraySize AVar2;
  ArraySize AVar3;
  Type *b_local;
  Type *a_local;
  
  bVar1 = areTypesSuitableForBinaryOp(a,b);
  if (bVar1) {
    AVar2 = Type::getVectorSize(a);
    AVar3 = Type::getVectorSize(b);
    if (AVar2 == AVar3) {
      Type::Type(&__return_storage_ptr__->resultType,bool_);
      Type::Type(&__return_storage_ptr__->operandType,bool_);
      return __return_storage_ptr__;
    }
  }
  memset(__return_storage_ptr__,0,0x18);
  Type::Type(&__return_storage_ptr__->resultType);
  memset(&__return_storage_ptr__->operandType,0,0x18);
  Type::Type(&__return_storage_ptr__->operandType);
  return __return_storage_ptr__;
}

Assistant:

static BinaryOperatorTypes getTypesForLogicalOp (const Type& a, const Type& b)
    {
        if (areTypesSuitableForBinaryOp (a, b) && a.getVectorSize() == b.getVectorSize())
            return { PrimitiveType::bool_, PrimitiveType::bool_ };

        return {};
    }